

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandISat(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nConfLimit;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  uint fVerbose;
  int iVar4;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  fVerbose = 0;
  Extra_UtilGetoptReset();
  nConfLimit = 100000;
  while( true ) {
    while( true ) {
      do {
        iVar1 = Extra_UtilGetopt(argc,argv,"Clzvh");
        iVar4 = globalUtilOptind;
      } while (iVar1 == 0x6c);
      if (iVar1 == -1) {
        if (pAVar2 == (Abc_Ntk_t *)0x0) {
          pcVar3 = "Empty network.\n";
        }
        else {
          if (pAVar2->ntkType == ABC_NTK_STRASH) {
            pAVar2 = Abc_NtkIvySat(pAVar2,nConfLimit,fVerbose);
            if (pAVar2 != (Abc_Ntk_t *)0x0) {
              Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
              return 0;
            }
            Abc_Print(-1,"Command has failed.\n");
            return 0;
          }
          pcVar3 = "This command works only for strashed networks.\n";
        }
        iVar4 = -1;
        goto LAB_001f5d2b;
      }
      if (iVar1 != 0x76) break;
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 != 0x43) goto LAB_001f5cc3;
    if (argc <= globalUtilOptind) break;
    nConfLimit = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar4 + 1;
    if ((int)nConfLimit < 0) {
LAB_001f5cc3:
      iVar4 = -2;
      Abc_Print(-2,"usage: isat [-C num] [-vh]\n");
      Abc_Print(-2,"\t         tries to prove the miter constant 0\n");
      Abc_Print(-2,"\t-C num : limit on the number of conflicts [default = %d]\n",(ulong)nConfLimit)
      ;
      pcVar3 = "yes";
      if (fVerbose == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose printout [default = %s]\n",pcVar3);
      pcVar3 = "\t-h     : print the command usage\n";
LAB_001f5d2b:
      Abc_Print(iVar4,pcVar3);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
  goto LAB_001f5cc3;
}

Assistant:

int Abc_CommandISat( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c, fUpdateLevel, fVerbose;
    int nConfLimit;

    extern Abc_Ntk_t * Abc_NtkIvySat( Abc_Ntk_t * pNtk, int nConfLimit, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    nConfLimit   = 100000;
    fUpdateLevel = 1;
    fVerbose     = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Clzvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfLimit < 0 )
                goto usage;
            break;
        case 'l':
            fUpdateLevel ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for strashed networks.\n" );
        return 1;
    }

    pNtkRes = Abc_NtkIvySat( pNtk, nConfLimit, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Command has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: isat [-C num] [-vh]\n" );
    Abc_Print( -2, "\t         tries to prove the miter constant 0\n" );
    Abc_Print( -2, "\t-C num : limit on the number of conflicts [default = %d]\n",    nConfLimit );
//    Abc_Print( -2, "\t-l     : toggle preserving the number of levels [default = %s]\n", fUpdateLevel? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose printout [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}